

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Compiler(Compiler *this)

{
  int pos;
  Prog *this_00;
  Inst *this_01;
  int fail;
  Compiler *this_local;
  
  Regexp::Walker<re2::Frag>::Walker(&this->super_Walker<re2::Frag>);
  (this->super_Walker<re2::Frag>)._vptr_Walker = (_func_int **)&PTR__Compiler_0049fe68;
  PODArray<re2::Prog::Inst>::PODArray(&this->inst_);
  std::
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::unordered_map(&this->rune_cache_);
  Frag::Frag(&this->rune_range_);
  this_00 = (Prog *)operator_new((size_t)this);
  Prog::Prog(this_00);
  this->prog_ = this_00;
  this->failed_ = false;
  this->encoding_ = kEncodingUTF8;
  this->reversed_ = false;
  this->ninst_ = 0;
  this->max_ninst_ = 1;
  this->max_mem_ = 0;
  pos = AllocInst(this,1);
  this_01 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,pos);
  Prog::Inst::InitFail(this_01);
  this->max_ninst_ = 0;
  return;
}

Assistant:

Compiler::Compiler() {
  prog_ = new Prog();
  failed_ = false;
  encoding_ = kEncodingUTF8;
  reversed_ = false;
  ninst_ = 0;
  max_ninst_ = 1;  // make AllocInst for fail instruction okay
  max_mem_ = 0;
  int fail = AllocInst(1);
  inst_[fail].InitFail();
  max_ninst_ = 0;  // Caller must change
}